

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O2

void ngx_http_proxy_set_vars(ngx_url_t *u,ngx_http_proxy_vars_t *v)

{
  u_char *puVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (u->family == 1) {
    (v->host_header).len = 9;
    (v->host_header).data = (u_char *)"localhost";
    (v->port).len = 0;
    (v->port).data = (u_char *)0x0;
    sVar2 = (u->host).len + (v->key_start).len + 6;
  }
  else {
    if (((u->field_0x48 & 8) == 0) && (u->port != u->default_port)) {
      (v->host_header).len = (u->host).len + (u->port_text).len + 1;
      (v->host_header).data = (u->host).data;
      puVar1 = (u->port_text).data;
      (v->port).len = (u->port_text).len;
      (v->port).data = puVar1;
    }
    else {
      puVar1 = (u->host).data;
      (v->host_header).len = (u->host).len;
      (v->host_header).data = puVar1;
      if (u->default_port == 0x50) {
        (v->port).len = 2;
        pcVar3 = "80";
      }
      else {
        (v->port).len = 3;
        pcVar3 = "443";
      }
      (v->port).data = (u_char *)pcVar3;
    }
    sVar2 = (v->key_start).len + (v->host_header).len;
  }
  (v->key_start).len = sVar2;
  puVar1 = (u->uri).data;
  (v->uri).len = (u->uri).len;
  (v->uri).data = puVar1;
  return;
}

Assistant:

static void
ngx_http_proxy_set_vars(ngx_url_t *u, ngx_http_proxy_vars_t *v)
{
    if (u->family != AF_UNIX) {

        if (u->no_port || u->port == u->default_port) {

            v->host_header = u->host;

            if (u->default_port == 80) {
                ngx_str_set(&v->port, "80");

            } else {
                ngx_str_set(&v->port, "443");
            }

        } else {
            v->host_header.len = u->host.len + 1 + u->port_text.len;
            v->host_header.data = u->host.data;
            v->port = u->port_text;
        }

        v->key_start.len += v->host_header.len;

    } else {
        ngx_str_set(&v->host_header, "localhost");
        ngx_str_null(&v->port);
        v->key_start.len += sizeof("unix:") - 1 + u->host.len + 1;
    }

    v->uri = u->uri;
}